

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_decompress1X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2)

{
  undefined1 *puVar1;
  HUF_DTable HVar2;
  BIT_DStream_status BVar3;
  int iVar4;
  size_t sVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  BIT_DStream_t bitD;
  
  HVar2 = *DTable;
  sVar5 = BIT_initDStream(&bitD,cSrc,cSrcSize);
  if (sVar5 < 0xffffffffffffff89) {
    puVar1 = (undefined1 *)((long)dst + dstSize);
    bVar6 = -(char)(HVar2 >> 0x10) & 0x3f;
    while ((BVar3 = BIT_reloadDStream(&bitD), dst < puVar1 + -3 && (BVar3 == BIT_DStream_unfinished)
           )) {
      uVar7 = (bitD.bitContainer << ((byte)bitD.bitsConsumed & 0x3f)) >> bVar6;
      iVar4 = *(byte *)((long)DTable + uVar7 * 2 + 5) + bitD.bitsConsumed;
      uVar9 = (bitD.bitContainer << ((byte)iVar4 & 0x3f)) >> bVar6;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar7 * 2 + 4);
      iVar4 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + iVar4;
      uVar8 = (bitD.bitContainer << ((byte)iVar4 & 0x3f)) >> bVar6;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
      iVar4 = (uint)*(byte *)((long)DTable + uVar8 * 2 + 5) + iVar4;
      uVar7 = (bitD.bitContainer << ((byte)iVar4 & 0x3f)) >> bVar6;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar8 * 2 + 4);
      bitD.bitsConsumed = (uint)*(byte *)((long)DTable + uVar7 * 2 + 5) + iVar4;
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar7 * 2 + 4);
      dst = (void *)((long)dst + 4);
    }
    for (; dst < puVar1; dst = (void *)((long)dst + 1)) {
      uVar7 = (bitD.bitContainer << ((byte)bitD.bitsConsumed & 0x3f)) >> bVar6;
      bitD.bitsConsumed = bitD.bitsConsumed + *(byte *)((long)DTable + uVar7 * 2 + 5);
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar7 * 2 + 4);
    }
    if (bitD.bitsConsumed != 0x40) {
      dstSize = 0xffffffffffffffec;
    }
    sVar5 = dstSize;
    if (bitD.ptr != bitD.start) {
      sVar5 = 0xffffffffffffffec;
    }
  }
  return sVar5;
}

Assistant:

HUF_DGEN(HUF_decompress1X1_usingDTable_internal)
HUF_DGEN(HUF_decompress4X1_usingDTable_internal)



size_t HUF_decompress1X1_usingDTable(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    if (dtd.tableType != 0) return ERROR(GENERIC);
    return HUF_decompress1X1_usingDTable_internal(dst, dstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
}